

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O0

MMFW * MMFW_NewFromFile(char *path,LPStatus *status)

{
  _Bool _Var1;
  int iVar2;
  MMFW *mmfw_00;
  FILE *pFVar3;
  uint32_t *puVar4;
  MMFWEntryName *pacVar5;
  long lVar6;
  ushort local_5a;
  undefined1 local_58 [6];
  uint16_t i_1;
  char name [32];
  uint16_t i;
  char mmfkind_s [12];
  MMFW *mmfw;
  LPStatus *status_local;
  char *path_local;
  
  mmfw_00 = (MMFW *)malloc(0x28);
  if (mmfw_00 == (MMFW *)0x0) {
    *status = LUNAPURPURA_ERROR;
  }
  else {
    pFVar3 = fopen(path,"rb");
    mmfw_00->fp = (FILE *)pFVar3;
    if (mmfw_00->fp == (FILE *)0x0) {
      *status = LUNAPURPURA_CANTOPENFILE;
    }
    else {
      _Var1 = ValidateMagicF(mmfw_00->fp,MMFW_MAGIC,4);
      if (_Var1) {
        fread(name + 0x1c,0xc,1,(FILE *)mmfw_00->fp);
        iVar2 = strncmp(name + 0x1c," Sounds",0xc);
        if (iVar2 == 0) {
          mmfw_00->kind = MMFW_KIND_SOUNDS;
        }
        else {
          iVar2 = strncmp(name + 0x1c," Pictures",0xc);
          if (iVar2 == 0) {
            mmfw_00->kind = MMFW_KIND_PICTURES;
          }
          else {
            iVar2 = strncmp(name + 0x1c," Films",0xc);
            if (iVar2 != 0) {
              *status = LUNAPURPURA_BADMAGIC;
              goto LAB_00102a2f;
            }
            mmfw_00->kind = MMFW_KIND_FILMS;
          }
        }
        fseek((FILE *)mmfw_00->fp,4,1);
        fseek((FILE *)mmfw_00->fp,0xe,1);
        ReadUint16(mmfw_00->fp,1,&mmfw_00->n_entries);
        puVar4 = (uint32_t *)calloc((long)(int)(mmfw_00->n_entries + 1),4);
        mmfw_00->offsets = puVar4;
        name[0x1a] = '\0';
        name[0x1b] = '\0';
        for (; (uint)(ushort)name._26_2_ < mmfw_00->n_entries + 1; name._26_2_ = name._26_2_ + 1) {
          ReadUint32(mmfw_00->fp,1,mmfw_00->offsets + (ushort)name._26_2_);
        }
        fseek((FILE *)mmfw_00->fp,2,1);
        pacVar5 = (MMFWEntryName *)calloc((ulong)mmfw_00->n_entries,0x20);
        mmfw_00->names = pacVar5;
        for (local_5a = 0; local_5a < mmfw_00->n_entries; local_5a = local_5a + 1) {
          fread(local_58,1,0x20,(FILE *)mmfw_00->fp);
          snprintf(mmfw_00->names[local_5a],0x20,"%s",local_58);
        }
        lVar6 = ftell((FILE *)mmfw_00->fp);
        mmfw_00->kind_metadata_start_pos = lVar6;
        *status = LUNAPURPURA_OK;
        return mmfw_00;
      }
      *status = LUNAPURPURA_BADMAGIC;
    }
  }
LAB_00102a2f:
  if (mmfw_00 != (MMFW *)0x0) {
    MMFW_Close(mmfw_00);
  }
  return (MMFW *)0x0;
}

Assistant:

MMFW *
MMFW_NewFromFile(const char *path, LPStatus *status)
{
	MMFW *mmfw = malloc(sizeof(MMFW));

	if (!mmfw) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	mmfw->fp = fopen(path, "rb");

	if (!mmfw->fp) {
		*status = LUNAPURPURA_CANTOPENFILE;
		goto fail;
	}

	if (!ValidateMagicF(mmfw->fp, MMFW_MAGIC, MMFW_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	char mmfkind_s[MMFW_KIND_STR_LEN];
	fread(mmfkind_s, MMFW_KIND_STR_LEN, 1, mmfw->fp);

	/* XXX There's probably a better way of doing this. */
	if (!strncmp(mmfkind_s, MMFW_KIND_SOUNDS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_SOUNDS;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_PICTURES_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_PICTURES;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_FILMS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_FILMS;
	} else {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	fseek(mmfw->fp, 4L, SEEK_CUR); /* [77, 77, 0, 2] */
	fseek(mmfw->fp, 14L, SEEK_CUR); /* not sure */
	ReadUint16(mmfw->fp, 1, &mmfw->n_entries);

	/*
	 * Obtain all the offsets for all the members.
	 *
	 * "+1" because there is one more offset stored in the file than there are
	 * members.  The last offset is always equal to the length of the file, which
	 * will be very helpful to know later on.
	 */
	mmfw->offsets = calloc(mmfw->n_entries+1, sizeof(uint32_t));

	for (uint16_t i = 0; i < (mmfw->n_entries+1); i++) {
		ReadUint32(mmfw->fp, 1, &(mmfw->offsets[i]));
	}

	fseek(mmfw->fp, 2L, SEEK_CUR); /* zeroes */

	/* Obtain the names of all the members. */
	char name[MMFW_ENTRY_NAME_LEN];

	mmfw->names = calloc(mmfw->n_entries, sizeof(MMFWEntryName));

	for (uint16_t i = 0; i < mmfw->n_entries; i++) {
		fread(name, 1, sizeof(name), mmfw->fp);
		snprintf(mmfw->names[i], MMFW_ENTRY_NAME_LEN, "%s", name);
	}

	/*
	 * What follows is metadata that is specific to the various kinds of MMFW
	 * archive. So let's keep track of our current file position.
	 */
	mmfw->kind_metadata_start_pos = ftell(mmfw->fp);

	*status = LUNAPURPURA_OK;
	return mmfw;

fail:
	if (mmfw) MMFW_Close(mmfw);
	return NULL;
}